

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  float fVar1;
  ImDrawList *this;
  ImGuiWindow *pIVar2;
  ImGuiCol idx;
  float _y;
  ImGuiPtrOrIndex IVar3;
  ImVec2 local_80;
  ImVec2 local_78;
  float local_70;
  float local_6c;
  float separator_max_x;
  float separator_min_x;
  float y;
  ImU32 col;
  void *local_58;
  int local_50;
  ImGuiPtrOrIndex local_48;
  ImGuiWindow *local_38;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *pIStack_20;
  ImGuiTabBarFlags flags_local;
  ImRect *tab_bar_bb_local;
  ImGuiTabBar *tab_bar_local;
  
  window = (ImGuiWindow *)GImGui;
  local_38 = GImGui->CurrentWindow;
  if ((local_38->SkipItems & 1U) == 0) {
    g._4_4_ = (float)flags;
    pIStack_20 = tab_bar_bb;
    tab_bar_bb_local = (ImRect *)tab_bar;
    if ((flags & 0x100000U) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar2 = window + 8;
    IVar3 = GetTabBarRefFromTabBar((ImGuiTabBar *)tab_bar_bb_local);
    local_58 = IVar3.Ptr;
    local_50 = IVar3.Index;
    local_48.Ptr = local_58;
    local_48.Index = local_50;
    ImVector<ImGuiPtrOrIndex>::push_back
              ((ImVector<ImGuiPtrOrIndex> *)&(pIVar2->DC).LastItemId,&local_48);
    window[8].DC.CursorStartPos = (ImVec2)tab_bar_bb_local;
    if (tab_bar_bb_local[2].Min.x == *(float *)&window[6].DrawListInst._VtxWritePtr) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x18d9,
                    "bool ImGui::BeginTabBarEx(ImGuiTabBar *, const ImRect &, ImGuiTabBarFlags)");
    }
    if ((((((uint)g._4_4_ & 1) != 0) && (((uint)tab_bar_bb_local[5].Max.x & 1) == 0)) &&
        (1 < (int)(tab_bar_bb_local->Min).x)) && (tab_bar_bb_local[2].Min.y != -NAN)) {
      qsort((void *)tab_bar_bb_local->Max,(long)(int)(tab_bar_bb_local->Min).x,0x20,
            TabItemComparerByVisibleOffset);
    }
    if (((uint)g._4_4_ & 0xc0) == 0) {
      g._4_4_ = (float)((uint)g._4_4_ | 0x40);
    }
    tab_bar_bb_local[5].Max.x = g._4_4_;
    tab_bar_bb_local[2].Max = pIStack_20->Min;
    tab_bar_bb_local[3].Min = pIStack_20->Max;
    *(undefined1 *)((long)&tab_bar_bb_local[6].Min.x + 1) = 1;
    tab_bar_bb_local[2].Min.y = tab_bar_bb_local[2].Min.x;
    tab_bar_bb_local[2].Min.x = *(float *)&window[6].DrawListInst._VtxWritePtr;
    tab_bar_bb_local[6].Max = (ImVec2)window[5].DrawList;
    fVar1 = tab_bar_bb_local[4].Min.x;
    _y = ImRect::GetHeight((ImRect *)&tab_bar_bb_local[2].Max);
    ImVec2::ImVec2((ImVec2 *)&y,fVar1,_y);
    ItemSize((ImVec2 *)&y,0.0);
    (local_38->DC).CursorPos.x = tab_bar_bb_local[2].Max.x;
    idx = 0x25;
    if (((uint)g._4_4_ & 0x200000) != 0) {
      idx = 0x23;
    }
    separator_min_x = (float)GetColorU32(idx,1.0);
    separator_max_x = tab_bar_bb_local[3].Min.y - 1.0;
    fVar1 = tab_bar_bb_local[2].Max.x;
    local_6c = ImFloor((local_38->WindowPadding).x * 0.5);
    local_6c = fVar1 - local_6c;
    fVar1 = tab_bar_bb_local[3].Min.x;
    local_70 = ImFloor((local_38->WindowPadding).x * 0.5);
    local_70 = fVar1 + local_70;
    this = local_38->DrawList;
    ImVec2::ImVec2(&local_78,local_6c,separator_max_x);
    ImVec2::ImVec2(&local_80,local_70,separator_max_x);
    ImDrawList::AddLine(this,&local_78,&local_80,(ImU32)separator_min_x,1.0);
    tab_bar_local._7_1_ = true;
  }
  else {
    tab_bar_local._7_1_ = false;
  }
  return tab_bar_local._7_1_;
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order.
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->FramePadding = g.Style.FramePadding;

    // Layout
    ItemSize(ImVec2(tab_bar->OffsetMaxIdeal, tab_bar->BarRect.GetHeight()));
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - ImFloor(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + ImFloor(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}